

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void CheckType(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  TidyTagId TVar1;
  Bool BVar2;
  uint code;
  ctmbstr *list;
  
  if (node == (Node *)0x0) {
    return;
  }
  if (node->tag == (Dict *)0x0) {
    return;
  }
  TVar1 = node->tag->id;
  if (TVar1 == TidyTag_BUTTON) {
    list = (ctmbstr *)&DAT_001c5240;
LAB_0013d471:
    CheckAttrValidity(doc,node,attval,list);
    return;
  }
  if (TVar1 == TidyTag_UL) {
    list = (ctmbstr *)&DAT_001c5260;
    goto LAB_0013d471;
  }
  if (TVar1 == TidyTag_LI) {
    if ((attval != (AttVal *)0x0) && (attval->value != (tmbstr)0x0)) {
      BVar2 = AttrValueIsAmong(attval,(ctmbstr *)&DAT_001c5260);
      if (BVar2 != no) {
        CheckLowerCaseAttrValue(doc,node,attval);
        return;
      }
LAB_0013d484:
      BVar2 = AttrValueIsAmong(attval,(ctmbstr *)&DAT_001c5280);
      if (BVar2 != no) {
        return;
      }
      code = 0x22b;
      goto LAB_0013d460;
    }
  }
  else {
    if (TVar1 != TidyTag_OL) {
      if (TVar1 != TidyTag_INPUT) {
        return;
      }
      list = (ctmbstr *)&DAT_001c5180;
      goto LAB_0013d471;
    }
    if ((attval != (AttVal *)0x0) && (attval->value != (tmbstr)0x0)) goto LAB_0013d484;
  }
  code = 0x256;
LAB_0013d460:
  prvTidyReportAttrError(doc,node,attval,code);
  return;
}

Assistant:

void CheckType( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    ctmbstr const valuesINPUT[] = {
        "text", "password", "checkbox", "radio", "submit", "reset", "file",
        "hidden", "image", "button", "color", "date", "datetime",
        "datetime-local", "email", "month", "number", "range", "search",
        "tel", "time", "url", "week", NULL};
    ctmbstr const valuesBUTTON[] = {"button", "submit", "reset", NULL};
    ctmbstr const valuesUL[] = {"disc", "square", "circle", NULL};
    ctmbstr const valuesOL[] = {"1", "a", "i", NULL};

    if (nodeIsINPUT(node))
        CheckAttrValidity( doc, node, attval, valuesINPUT );
    else if (nodeIsBUTTON(node))
        CheckAttrValidity( doc, node, attval, valuesBUTTON );
    else if (nodeIsUL(node))
        CheckAttrValidity( doc, node, attval, valuesUL );
    else if (nodeIsOL(node))
    {
        if (!AttrHasValue(attval))
        {
            TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
            return;
        }
        if (!AttrValueIsAmong(attval, valuesOL))
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
    else if (nodeIsLI(node))
    {
        if (!AttrHasValue(attval))
        {
            TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
            return;
        }
        if (AttrValueIsAmong(attval, valuesUL))
            CheckLowerCaseAttrValue( doc, node, attval );
        else if (!AttrValueIsAmong(attval, valuesOL))
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
    return;
}